

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hpp
# Opt level: O3

bool __thiscall
boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::
pop<depspawn::internal::TaskPool::Task*>
          (queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>> *this,
          Task **ret)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  short sVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  
  do {
    do {
      while( true ) {
        do {
          uVar4 = *(uint *)this;
          uVar7 = uVar4 & 0xffff;
          sVar6 = (short)uVar4;
          puVar5 = (uint *)((ulong)(uVar7 << 6) + *(long *)(this + 0x80));
          if (sVar6 == *(short *)(this + 0x88)) {
            puVar5 = (uint *)0x0;
          }
          uVar2 = *(uint *)(this + 0x40);
          uVar3 = *puVar5 & 0xffff;
          lVar8 = 0;
          if ((short)*puVar5 != *(short *)(this + 0x88)) {
            lVar8 = (ulong)(uVar3 << 6) + *(long *)(this + 0x80);
          }
        } while ((sVar6 != (short)*(uint *)this) || (0xffff < (*(uint *)this ^ uVar4)));
        if (sVar6 != (short)uVar2) break;
        if (lVar8 == 0) goto LAB_0010b704;
        LOCK();
        if (uVar2 == *(uint *)(this + 0x40)) {
          *(uint *)(this + 0x40) = (uVar2 & 0xffff0000) + uVar3 + 0x10000;
        }
        UNLOCK();
      }
    } while (lVar8 == 0);
    *ret = *(Task **)(lVar8 + 8);
    LOCK();
    uVar1 = *(uint *)this;
    if (uVar4 == uVar1) {
      *(uint *)this = (uVar4 & 0xffff0000) + uVar3 + 0x10000;
    }
    UNLOCK();
  } while (uVar4 != uVar1);
  lVar8 = *(long *)(this + 0x80);
  uVar3 = *(uint *)(this + 0x90);
  *(short *)(lVar8 + (ulong)(uVar7 << 6)) = (short)uVar3;
  LOCK();
  uVar4 = *(uint *)(this + 0x90);
  bVar9 = uVar3 == uVar4;
  if (bVar9) {
    *(uint *)(this + 0x90) = uVar3 & 0xffff0000 | uVar7;
    uVar4 = uVar3;
  }
  UNLOCK();
  if (!bVar9) {
    do {
      *(short *)(lVar8 + (ulong)(uVar7 << 6)) = (short)uVar4;
      LOCK();
      uVar3 = *(uint *)(this + 0x90);
      bVar9 = uVar4 == uVar3;
      if (bVar9) {
        *(uint *)(this + 0x90) = uVar4 & 0xffff0000 | uVar7;
        uVar3 = uVar4;
      }
      uVar4 = uVar3;
      UNLOCK();
    } while (!bVar9);
  }
LAB_0010b704:
  return sVar6 != (short)uVar2;
}

Assistant:

bool pop (U & ret)
    {
        for (;;) {
            tagged_node_handle head = head_.load(memory_order_acquire);
            node * head_ptr = pool.get_pointer(head);

            tagged_node_handle tail = tail_.load(memory_order_acquire);
            tagged_node_handle next = head_ptr->next.load(memory_order_acquire);
            node * next_ptr = pool.get_pointer(next);

            tagged_node_handle head2 = head_.load(memory_order_acquire);
            if (BOOST_LIKELY(head == head2)) {
                if (pool.get_handle(head) == pool.get_handle(tail)) {
                    if (next_ptr == 0)
                        return false;

                    tagged_node_handle new_tail(pool.get_handle(next), tail.get_next_tag());
                    tail_.compare_exchange_strong(tail, new_tail);

                } else {
                    if (next_ptr == 0)
                        /* this check is not part of the original algorithm as published by michael and scott
                         *
                         * however we reuse the tagged_ptr part for the freelist and clear the next part during node
                         * allocation. we can observe a null-pointer here.
                         * */
                        continue;
                    detail::copy_payload(next_ptr->data, ret);

                    tagged_node_handle new_head(pool.get_handle(next), head.get_next_tag());
                    if (head_.compare_exchange_weak(head, new_head)) {
                        pool.template destruct<true>(head);
                        return true;
                    }
                }
            }
        }
    }